

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void lua_upvaluejoin(lua_State *L,int fidx1,int n1,int fidx2,int n2)

{
  lua_CFunction p_Var1;
  lua_CFunction p_Var2;
  long *plVar3;
  UpVal *uv;
  TValue *pTVar4;
  long lVar5;
  
  pTVar4 = index2addr(L,fidx1);
  p_Var1 = (pTVar4->value_).f;
  lVar5 = (long)n1;
  pTVar4 = index2addr(L,fidx2);
  p_Var2 = (pTVar4->value_).f;
  luaC_upvdeccount(L,*(UpVal **)(p_Var1 + lVar5 * 8 + 0x18));
  plVar3 = *(long **)(p_Var2 + (long)n2 * 8 + 0x18);
  *(long **)(p_Var1 + lVar5 * 8 + 0x18) = plVar3;
  plVar3[1] = plVar3[1] + 1;
  if ((long *)*plVar3 != plVar3 + 2) {
    *(undefined4 *)(plVar3 + 3) = 1;
  }
  uv = *(UpVal **)(p_Var1 + (lVar5 + -1) * 8 + 0x20);
  if ((uv->v == (TValue *)&uv->u & (byte)uv->v->tt_ >> 6) == 1) {
    luaC_upvalbarrier_(L,uv);
    return;
  }
  return;
}

Assistant:

LUA_API void lua_upvaluejoin (lua_State *L, int fidx1, int n1,
                                            int fidx2, int n2) {
  LClosure *f1;
  UpVal **up1 = getupvalref(L, fidx1, n1, &f1);
  UpVal **up2 = getupvalref(L, fidx2, n2, NULL);
  luaC_upvdeccount(L, *up1);
  *up1 = *up2;
  (*up1)->refcount++;
  if (upisopen(*up1)) (*up1)->u.open.touched = 1;
  luaC_upvalbarrier(L, *up1);
}